

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_stage
               (StateRecorder *recorder,Hasher *h,VkPipelineShaderStageCreateInfo *stage)

{
  void **ppvVar1;
  byte bVar2;
  bool bVar3;
  ulong in_RAX;
  VkBaseInStructure *base_in;
  ulong uVar4;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *pVVar5;
  byte *pbVar6;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  Hash hash;
  ulong local_28;
  
  pbVar6 = (byte *)stage->pName;
  if (pbVar6 == (byte *)0x0) {
    return false;
  }
  uVar4 = (h->h * 0x100000001b3 ^ (ulong)stage->flags) * 0x100000001b3 ^ 0xff;
  h->h = uVar4;
  bVar2 = *pbVar6;
  while (bVar2 != 0) {
    pbVar6 = pbVar6 + 1;
    uVar4 = uVar4 * 0x100000001b3 ^ (ulong)bVar2;
    h->h = uVar4;
    bVar2 = *pbVar6;
  }
  h->h = uVar4 * 0x100000001b3 ^ (ulong)stage->stage;
  local_28 = in_RAX;
  if (stage->module == (VkShaderModule)0x0) {
    info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)stage->pNext;
    pVVar5 = info;
    if (info != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      do {
        if (pVVar5->sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
          if (pVVar5->pIdentifier < (uint8_t *)0x4) {
            local_28 = 0xaf63bd4c8601b7df;
          }
          else {
            local_28 = 0xcbf29ce484222325;
            uVar4 = 0;
            do {
              local_28 = (ulong)*(uint *)(*(long *)(pVVar5 + 1) + uVar4 * 4) ^
                         local_28 * 0x100000001b3;
              uVar4 = uVar4 + 1;
            } while ((ulong)pVVar5->pIdentifier >> 2 != uVar4);
            local_28 = local_28 * 0x100000001b3;
          }
          local_28 = pVVar5->identifierSize ^ local_28;
          goto LAB_0011eb1e;
        }
        ppvVar1 = &pVVar5->pNext;
        pVVar5 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1;
      } while ((VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)*ppvVar1 !=
               (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0);
      do {
        if (info->sType == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT
           ) {
          bVar3 = StateRecorder::Impl::get_hash_for_shader_module(recorder->impl,info,&local_28);
          goto LAB_0011ea83;
        }
        info = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext;
      } while (info != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0);
    }
  }
  else {
    bVar3 = StateRecorder::get_hash_for_shader_module(recorder,stage->module,&local_28);
LAB_0011ea83:
    if (bVar3 != false) {
LAB_0011eb1e:
      uVar4 = (local_28 & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^ local_28 >> 0x20;
      h->h = uVar4;
      if (stage->pSpecializationInfo == (VkSpecializationInfo *)0x0) {
        h->h = uVar4 * 0x100000001b3;
      }
      else {
        hash_specialization_info(h,stage->pSpecializationInfo);
      }
      bVar3 = hash_pnext_chain(recorder,h,stage->pNext,(DynamicStateInfo *)0x0,0);
      return bVar3;
    }
  }
  return false;
}

Assistant:

static bool compute_hash_stage(const StateRecorder &recorder, Hasher &h, const VkPipelineShaderStageCreateInfo &stage)
{
	if (!stage.pName)
		return false;

	h.u32(stage.flags);
	h.string(stage.pName);
	h.u32(stage.stage);

	Hash hash;
	if (stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	if (stage.pSpecializationInfo)
		hash_specialization_info(h, *stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, stage.pNext, nullptr, 0))
		return false;

	return true;
}